

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O0

Uint32 __thiscall
Diligent::SerializedPipelineStateImpl::GetPatchedShaderCount
          (SerializedPipelineStateImpl *this,ARCHIVE_DEVICE_DATA_FLAGS DeviceType)

{
  bool bVar1;
  PIPELINE_STATE_STATUS PVar2;
  uint uVar3;
  Char *pCVar4;
  char (*in_R8) [68];
  size_type local_80;
  const_reference local_78;
  value_type *Shaders;
  undefined1 local_68 [4];
  DeviceType Type;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  ARCHIVE_DEVICE_DATA_FLAGS DeviceType_local;
  SerializedPipelineStateImpl *this_local;
  
  msg.field_2._12_4_ = DeviceType;
  PVar2 = std::atomic<Diligent::PIPELINE_STATE_STATUS>::load(&this->m_Status,memory_order_seq_cst);
  if (PVar2 != PIPELINE_STATE_STATUS_READY) {
    FormatString<char[17],char_const*,char[68]>
              ((string *)local_38,(Diligent *)"Pipeline state \'",(char (*) [17])&this->m_Desc,
               (char **)"\' is not ready. Use GetStatus() to check the pipeline state status.",in_R8
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"GetPatchedShaderCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1cc);
    std::__cxx11::string::~string((string *)local_38);
  }
  bVar1 = IsPowerOfTwo<Diligent::ARCHIVE_DEVICE_DATA_FLAGS>(msg.field_2._12_4_);
  if (!bVar1) {
    FormatString<char[41]>
              ((string *)local_68,(char (*) [41])"Only single device data flag is expected");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"GetPatchedShaderCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1cd);
    std::__cxx11::string::~string((string *)local_68);
  }
  Shaders._4_4_ = ArchiveDeviceDataFlagToArchiveDeviceType(msg.field_2._12_4_);
  local_78 = std::
             array<std::vector<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>,_7UL>
             ::operator[](&(this->m_Data).Shaders,(ulong)Shaders._4_4_);
  local_80 = std::
             vector<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
             ::size(local_78);
  uVar3 = StaticCast<unsigned_int,unsigned_long>(&local_80);
  return uVar3;
}

Assistant:

Uint32 DILIGENT_CALL_TYPE SerializedPipelineStateImpl::GetPatchedShaderCount(ARCHIVE_DEVICE_DATA_FLAGS DeviceType) const
{
    DEV_CHECK_ERR(m_Status.load() == PIPELINE_STATE_STATUS_READY, "Pipeline state '", m_Desc.Name, "' is not ready. Use GetStatus() to check the pipeline state status.");
    DEV_CHECK_ERR(IsPowerOfTwo(DeviceType), "Only single device data flag is expected");
    const auto  Type    = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceType);
    const auto& Shaders = m_Data.Shaders[static_cast<size_t>(Type)];
    return StaticCast<Uint32>(Shaders.size());
}